

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptorProto::EnumDescriptorProto
          (EnumDescriptorProto *this,EnumDescriptorProto *from)

{
  InternalMetadata *this_00;
  ulong uVar1;
  bool bVar2;
  EnumOptions *this_01;
  undefined8 *puVar3;
  
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = 0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumDescriptorProto_004dd3e8;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::RepeatedPtrField
            (&this->value_,&from->value_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::RepeatedPtrField
            (&this->reserved_range_,&from->reserved_range_);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->reserved_name_,&from->reserved_name_);
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (this_00,&(from->super_Message).super_MessageLite._internal_metadata_);
  (this->name_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    uVar1 = this_00->ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    internal::ArenaStringPtr::Set
              (&this->name_,(ulong)(from->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar3);
  }
  bVar2 = _internal_has_options(from);
  if (bVar2) {
    this_01 = (EnumOptions *)operator_new(0x50);
    EnumOptions::EnumOptions(this_01,from->options_);
  }
  else {
    this_01 = (EnumOptions *)0x0;
  }
  this->options_ = this_01;
  return;
}

Assistant:

EnumDescriptorProto::EnumDescriptorProto(const EnumDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      value_(from.value_),
      reserved_range_(from.reserved_range_),
      reserved_name_(from.reserved_name_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_name()) {
    name_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_name(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_options()) {
    options_ = new ::PROTOBUF_NAMESPACE_ID::EnumOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.EnumDescriptorProto)
}